

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 *puVar4;
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar5;
  pointer pdVar6;
  byte bVar7;
  initializer_list<double> __l;
  undefined1 local_111;
  value_type local_110;
  vector<double,_std::allocator<double>_> test;
  function<int_(double)> func;
  insert_iterator<std::unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_c0;
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  expectedKeyBy;
  unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  keyed;
  
  bVar7 = 0;
  keyed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x4000000000000000;
  keyed._M_h._M_element_count = 0x4002666666666666;
  keyed._M_h._M_buckets = (__buckets_ptr)0x3ff0000000000000;
  keyed._M_h._M_bucket_count = 0x3ff3333333333333;
  keyed._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  keyed._M_h._M_rehash_policy._4_4_ = 0x40080000;
  __l._M_len = 5;
  __l._M_array = (iterator)&keyed;
  std::vector<double,_std::allocator<double>_>::vector(&test,__l,(allocator_type *)&expectedKeyBy);
  func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  func.super__Function_base._M_functor._8_8_ = 0;
  func._M_invoker =
       std::
       _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp:13:33)>
       ::_M_invoke;
  func.super__Function_base._M_manager =
       std::
       _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp:13:33)>
       ::_M_manager;
  local_c0.container = &keyed;
  puVar4 = &DAT_00104060;
  puVar5 = local_c0.container;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (puVar5->_M_h)._M_buckets = (__buckets_ptr)*puVar4;
    puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    puVar5 = (unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
              *)((long)puVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  std::
  _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_Hashtable<std::pair<int_const,double>const*>
            ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&expectedKeyBy,local_c0.container,&stack0xffffffffffffffd8,0,&local_c0,&local_110,
             &local_111);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test keyBy...");
  std::endl<char,std::char_traits<char>>(poVar2);
  keyed._M_h._M_buckets = &keyed._M_h._M_single_bucket;
  keyed._M_h._M_bucket_count = 1;
  keyed._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  keyed._M_h._M_element_count = 0;
  keyed._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  keyed._M_h._M_rehash_policy._M_next_resize = 0;
  keyed._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c0.iter.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_int,_double>,_false>)(__node_type *)0x0;
  for (pdVar6 = test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 != test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    local_110.first = std::function<int_(double)>::operator()(&func,*pdVar6);
    local_110.second = *pdVar6;
    std::
    insert_iterator<std::unordered_multimap<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
    ::operator=(&local_c0,&local_110);
  }
  bVar1 = std::__detail::
          _Equality<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>,_false>
          ::_M_equal((_Equality<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>,_false>
                      *)&expectedKeyBy,&keyed._M_h);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable(&keyed._M_h);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable(&expectedKeyBy._M_h);
    std::_Function_base::~_Function_base(&func.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&test.super__Vector_base<double,_std::allocator<double>_>);
    return 0;
  }
  __assert_fail("expectedKeyBy==keyed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/keyBy/main.cpp"
                ,0x17,"int main()");
}

Assistant:

int main(){
   
  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< int(double) > func= [] (const double & element){return (int)element;};
  unordered_multimap<int, double> expectedKeyBy={
      make_pair(1,1.0),
      make_pair(1,1.2),
      make_pair(2,2.0),
      make_pair(2,2.3),
      make_pair(3, 3.0)      
  };
  cout << "Test keyBy..." << endl;
  auto keyed = Functional::keyBy(test,func); 
  assert( expectedKeyBy==keyed);
  cout << "passed!" << endl;
  

  return 0;

}